

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  ushort uVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  ulong uVar7;
  int local_run_end;
  int run_end;
  uint64_t cur_word_with_1s;
  int run_start_1;
  int local_run_start;
  int run_count;
  uint64_t cur_word;
  int long_ctr;
  run_container_t *answer_1;
  int32_t size_as_bitset_container;
  int32_t size_as_run_container_1;
  int32_t n_runs_1;
  bitset_container_t *c_qua_bitset;
  uint uStack_58;
  uint16_t cur_val;
  int i;
  int run_start;
  int prev;
  run_container_t *answer;
  int32_t size_as_array_container;
  int32_t card;
  int32_t size_as_run_container;
  int32_t n_runs;
  array_container_t *c_qua_array;
  container_t *newc;
  uint8_t *typecode_after_local;
  uint8_t typecode_original_local;
  container_t *c_local;
  
  if (typecode_original == '\x03') {
    c_local = convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (c_local != c) {
      container_free(c,'\x03');
    }
  }
  else {
    c_local = c;
    if (typecode_original == '\x02') {
      iVar3 = array_container_number_of_runs((array_container_t *)c);
      iVar4 = run_container_serialized_size_in_bytes(iVar3);
      iVar5 = array_container_cardinality((array_container_t *)c);
      iVar6 = array_container_serialized_size_in_bytes(iVar5);
      if (iVar4 < iVar6) {
        c_local = run_container_create_given_capacity(iVar3);
        i = -2;
        uStack_58 = 0xffffffff;
        if (iVar5 < 1) {
          __assert_fail("card > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x2e5c,
                        "container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)");
        }
        for (c_qua_bitset._4_4_ = 0; c_qua_bitset._4_4_ < iVar5;
            c_qua_bitset._4_4_ = c_qua_bitset._4_4_ + 1) {
          uVar1 = *(ushort *)(*(long *)((long)c + 8) + (long)c_qua_bitset._4_4_ * 2);
          if ((uint)uVar1 != i + 1U) {
            if (uStack_58 != 0xffffffff) {
              add_run((run_container_t *)c_local,uStack_58,i);
            }
            uStack_58 = (uint)uVar1;
          }
          i = (int)*(ushort *)(*(long *)((long)c + 8) + (long)c_qua_bitset._4_4_ * 2);
        }
        if ((int)uStack_58 < 0) {
          __assert_fail("run_start >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x2e66,
                        "container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)");
        }
        add_run((run_container_t *)c_local,uStack_58,i);
        *typecode_after = '\x03';
        array_container_free((array_container_t *)c);
      }
      else {
        *typecode_after = '\x02';
      }
    }
    else {
      if (typecode_original != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2ea6,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      iVar5 = bitset_container_number_of_runs((bitset_container_t *)c);
      iVar3 = run_container_serialized_size_in_bytes(iVar5);
      iVar4 = bitset_container_serialized_size_in_bytes();
      if (iVar3 < iVar4) {
        if (iVar5 < 1) {
          __assert_fail("n_runs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x2e7d,
                        "container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)");
        }
        c_local = run_container_create_given_capacity(iVar5);
        cur_word._4_4_ = 0;
        _local_run_start = **(ulong **)((long)c + 8);
        while( true ) {
          while (_local_run_start == 0 && cur_word._4_4_ < 0x3ff) {
            cur_word._4_4_ = cur_word._4_4_ + 1;
            _local_run_start = *(ulong *)(*(long *)((long)c + 8) + (long)cur_word._4_4_ * 8);
          }
          if (_local_run_start == 0) {
            bitset_container_free((bitset_container_t *)c);
            *typecode_after = '\x03';
            return (run_container_t *)c_local;
          }
          iVar5 = 0;
          for (uVar7 = _local_run_start; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000)
          {
            iVar5 = iVar5 + 1;
          }
          iVar5 = iVar5 + cur_word._4_4_ * 0x40;
          _local_run_end = _local_run_start | _local_run_start - 1;
          while (_local_run_end == 0xffffffffffffffff && cur_word._4_4_ < 0x3ff) {
            cur_word._4_4_ = cur_word._4_4_ + 1;
            _local_run_end = *(ulong *)(*(long *)((long)c + 8) + (long)cur_word._4_4_ * 8);
          }
          if (_local_run_end == 0xffffffffffffffff) break;
          iVar2 = 0;
          for (uVar7 = _local_run_end ^ 0xffffffffffffffff; (uVar7 & 1) == 0;
              uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            iVar2 = iVar2 + 1;
          }
          add_run((run_container_t *)c_local,iVar5,iVar2 + cur_word._4_4_ * 0x40 + -1);
          _local_run_start = _local_run_end & _local_run_end + 1;
        }
        add_run((run_container_t *)c_local,iVar5,cur_word._4_4_ * 0x40 + 0x3f);
        bitset_container_free((bitset_container_t *)c);
        *typecode_after = '\x03';
      }
      else {
        *typecode_after = '\x01';
      }
    }
  }
  return c_local;
}

Assistant:

container_t *convert_run_optimize(
    container_t *c, uint8_t typecode_original,
    uint8_t *typecode_after
){
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc = convert_run_to_efficient_container(
                                    CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        int run_count = 0;
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = __builtin_ctzll(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = __builtin_ctzll(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            run_count++;
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        __builtin_unreachable();
        return NULL;
    }
}